

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O1

int FmsIOAddTypedIntArray(FmsIOContext *ctx,char *path,FmsIntType type,void *values,FmsInt n)

{
  ulong uVar1;
  ulong uVar2;
  int8_t *v;
  bool bVar3;
  
  fprintf((FILE *)ctx->fp,"%s/Size: %lu\n",path,n);
  fprintf((FILE *)ctx->fp,"%s/Type: %s\n",path,FmsIntTypeNames[type]);
  switch((ulong)type) {
  case 0:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%d",(ulong)(uint)(int)*(char *)((long)values + uVar2));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  case 1:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%d",(ulong)(uint)(int)*(short *)((long)values + uVar2 * 2));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  case 2:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%d",(ulong)*(uint *)((long)values + uVar2 * 4));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  case 3:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%ld",*(undefined8 *)((long)values + uVar2 * 8));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  case 4:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%u",(ulong)*(byte *)((long)values + uVar2));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  case 5:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%u",(ulong)*(ushort *)((long)values + uVar2 * 2));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  case 6:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%u",(ulong)*(uint *)((long)values + uVar2 * 4));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  case 7:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (n != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        do {
          fprintf((FILE *)ctx->fp,"%lu",*(undefined8 *)((long)values + uVar2 * 8));
          if (uVar2 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
          bVar3 = uVar1 < 2;
          uVar1 = uVar1 + 1;
        } while (bVar3 && uVar2 < n);
        if (uVar2 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
        uVar1 = 0;
      } while (uVar2 < n);
    }
    break;
  default:
    return 1;
  }
  fwrite("]\n",2,1,(FILE *)ctx->fp);
  return 0;
}

Assistant:

static int
FmsIOAddTypedIntArray(FmsIOContext *ctx, const char *path, FmsIntType type,
                      const void *values, FmsInt n) {
  /* Shall we stick some type information into the ASCII to preserve the intended IntType? */
  size_t i, j;
  int retval = 0;
  const unsigned int epl = FMS_ELE_PER_LINE;

  fprintf(ctx->fp, "%s/Size: " FMS_LU "\n", path, n);
  fprintf(ctx->fp, "%s/Type: %s\n", path, FmsIntTypeNames[type]);

#define PRINT_MACRO(typename, T, format)    \
    do {                                    \
    const T *v = (const T *)(values);       \
    fprintf(ctx->fp, "%s/Values: [", path); \
    for(i = 0; i < n;) {                    \
        for(j = 0; j < epl && i < n; j++, i++) { \
            fprintf(ctx->fp, format, v[i]); \
            if(i < n-1)                     \
                fprintf(ctx->fp, ", ");     \
        }                                   \
        if(i < n-1)                         \
            fprintf(ctx->fp, "\n");         \
    }                                       \
    fprintf(ctx->fp, "]\n");                \
    } while(0)

  switch(type) {
#define CASES(typename, T, format)          \
        case typename:                          \
            PRINT_MACRO(typename, T, format);   \
            break;
    FOR_EACH_INT_TYPE(CASES)
#undef CASES
  default:
    E_RETURN(1);
    break;
  }
#undef PRINT_MACRO
  return retval;
}